

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_ep_accept_cb(void *arg)

{
  nng_stream *conn_00;
  nng_stream *conn;
  ipc_pipe *piStack_28;
  int rv;
  ipc_pipe *p;
  nni_aio *aio;
  ipc_ep *ep;
  void *arg_local;
  
  p = (ipc_pipe *)((long)arg + 0x60);
  aio = (nni_aio *)arg;
  ep = (ipc_ep *)arg;
  nni_mtx_lock((nni_mtx *)arg);
  conn._4_4_ = nni_aio_result((nni_aio *)p);
  if (conn._4_4_ == NNG_OK) {
    conn_00 = (nng_stream *)nni_aio_get_output((nni_aio *)p,0);
    if (((ulong)(aio->a_task).task_arg & 0x1000000) == 0) {
      conn._4_4_ = nni_pipe_alloc_listener
                             (&stack0xffffffffffffffd8,*(nni_listener **)&(aio->a_task).task_busy);
      if (conn._4_4_ == NNG_OK) {
        ipc_pipe_start(piStack_28,conn_00,(ipc_ep *)aio);
        nng_stream_listener_accept
                  ((nng_stream_listener *)(aio->a_task).task_tq,
                   (nng_aio *)((long)&(aio->a_task).task_mtx.mtx + 0x10));
        nni_mtx_unlock((nni_mtx *)aio);
        return;
      }
      nng_stream_free(conn_00);
    }
    else {
      conn._4_4_ = NNG_ECLOSED;
      nng_stream_free(conn_00);
    }
  }
  p = *(ipc_pipe **)((long)&(aio->a_task).task_mtx.mtx + 8);
  if (p != (ipc_pipe *)0x0) {
    *(undefined8 *)((long)&(aio->a_task).task_mtx.mtx + 8) = 0;
    nni_aio_finish_error((nni_aio *)p,conn._4_4_);
  }
  if (conn._4_4_ != NNG_ENOMEM) {
    if (conn._4_4_ == NNG_ECLOSED) goto LAB_00138b08;
    if (conn._4_4_ != NNG_ENOFILES) {
      if (conn._4_4_ != NNG_ESTOPPED) {
        nng_stream_listener_accept
                  ((nng_stream_listener *)(aio->a_task).task_tq,
                   (nng_aio *)((long)&(aio->a_task).task_mtx.mtx + 0x10));
      }
      goto LAB_00138b08;
    }
  }
  nng_sleep_aio(10,(nng_aio *)((long)&aio[1].a_task.task_mtx.mtx + 0x10));
LAB_00138b08:
  nni_mtx_unlock((nni_mtx *)aio);
  return;
}

Assistant:

static void
ipc_ep_accept_cb(void *arg)
{
	ipc_ep     *ep  = arg;
	nni_aio    *aio = &ep->conn_aio;
	ipc_pipe   *p;
	int         rv;
	nng_stream *conn;

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		rv = NNG_ECLOSED;
		nng_stream_free(conn);
		goto error;
	}
	rv = nni_pipe_alloc_listener((void **) &p, ep->nlistener);
	if (rv != 0) {
		nng_stream_free(conn);
		goto error;
	}

	ipc_pipe_start(p, conn, ep);

	nng_stream_listener_accept(ep->listener, &ep->conn_aio);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// When an error here occurs, let's send a notice up to the consumer.
	// That way it can be reported properly.
	if ((aio = ep->user_aio) != NULL) {
		ep->user_aio = NULL;
		nni_aio_finish_error(aio, rv);
	}

	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ESTOPPED:
		break;
	case NNG_ENOMEM:
	case NNG_ENOFILES:
		nng_sleep_aio(10, &ep->time_aio);
		break;

	default:
		nng_stream_listener_accept(ep->listener, &ep->conn_aio);
		break;
	}
	nni_mtx_unlock(&ep->mtx);
}